

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Chapter::Display::WriteDisplay(Display *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64 uVar2;
  long lVar3;
  long lVar4;
  long *in_RSI;
  char *in_RDI;
  int64_t stop;
  int64_t start;
  uint64_t display_size;
  uint64_t payload_size;
  char *in_stack_ffffffffffffffb8;
  IMkvWriter *in_stack_ffffffffffffffc8;
  uint64 local_20;
  uint64_t local_8;
  
  local_20 = EbmlElementSize((uint64)in_stack_ffffffffffffffc8,in_RDI);
  if (*(long *)(in_RDI + 8) != 0) {
    uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffc8,in_RDI);
    local_20 = uVar2 + local_20;
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffc8,in_RDI);
    local_20 = uVar2 + local_20;
  }
  uVar2 = EbmlMasterElementSize((uint64)in_RDI,(uint64)in_stack_ffffffffffffffb8);
  local_8 = uVar2 + local_20;
  if (in_RSI != (long *)0x0) {
    lVar3 = (**(code **)(*in_RSI + 8))();
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffc8,(uint64)in_RDI,(uint64)in_stack_ffffffffffffffb8);
    if (bVar1) {
      bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc8,(uint64)in_RDI,in_stack_ffffffffffffffb8);
      if (bVar1) {
        if ((*(long *)(in_RDI + 8) == 0) ||
           (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc8,(uint64)in_RDI,
                                     in_stack_ffffffffffffffb8), bVar1)) {
          if ((*(long *)(in_RDI + 0x10) == 0) ||
             (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc8,(uint64)in_RDI,
                                       in_stack_ffffffffffffffb8), bVar1)) {
            lVar4 = (**(code **)(*in_RSI + 8))();
            if ((lVar3 <= lVar4) && (lVar4 - lVar3 != local_8)) {
              local_8 = 0;
            }
          }
          else {
            local_8 = 0;
          }
        }
        else {
          local_8 = 0;
        }
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

uint64_t Chapter::Display::WriteDisplay(IMkvWriter* writer) const {
  uint64_t payload_size = EbmlElementSize(libwebm::kMkvChapString, title_);

  if (language_)
    payload_size += EbmlElementSize(libwebm::kMkvChapLanguage, language_);

  if (country_)
    payload_size += EbmlElementSize(libwebm::kMkvChapCountry, country_);

  const uint64_t display_size =
      EbmlMasterElementSize(libwebm::kMkvChapterDisplay, payload_size) +
      payload_size;

  if (writer == NULL)
    return display_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapterDisplay,
                              payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapString, title_))
    return 0;

  if (language_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvChapLanguage, language_))
      return 0;
  }

  if (country_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvChapCountry, country_))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != display_size)
    return 0;

  return display_size;
}